

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O1

void __thiscall EventLoop::addChannel(EventLoop *this,ChannelPtr *channel)

{
  EPoller *this_00;
  ChannelPtr local_28;
  
  assertInLoopThread(this);
  this_00 = (this->poller_).super___shared_ptr<EPoller,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_28.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (channel->super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_28.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (channel->super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (channel->super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (channel->super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0;
  EPoller::addChannel(this_00,&local_28);
  if (local_28.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  return;
}

Assistant:

void EventLoop::addChannel(ChannelPtr channel) {
    assertInLoopThread();
    poller_->addChannel(std::move(channel));
}